

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCSwitchfinder.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  istream *piVar2;
  allocator local_2d9;
  allocator local_2d8 [8];
  string reference;
  string line;
  string local_290;
  string local_270;
  string local_250 [32];
  ifstream input;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Starting ");
  poVar1 = std::operator<<(poVar1,argv[1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string(local_250,argv[3],&local_2d9);
  std::__cxx11::string::string((string *)&reference,"",(allocator *)&input);
  std::ifstream::ifstream(&input,local_250,_S_in);
  std::__cxx11::string::string((string *)&line,"",local_2d8);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&input,(string *)&line);
    if (*(int *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20) != 0) break;
    if ((line._M_string_length != 0) && (*line._M_dataplus._M_p != '>')) {
      std::__cxx11::string::append((string *)&reference);
      std::__cxx11::string::assign((char *)&line);
    }
  }
  std::locale::locale((locale *)local_2d8);
  boost::algorithm::to_upper<std::__cxx11::string>(&reference,(locale *)local_2d8);
  std::locale::~locale((locale *)local_2d8);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&input);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::string((string *)&local_270,argv[1],(allocator *)&input);
  std::__cxx11::string::string((string *)&local_290,argv[2],(allocator *)&line);
  findSwitches(&local_270,&local_290,&reference);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ended");
  poVar1 = std::operator<<(poVar1,argv[1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&reference);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   
    cout << "Starting "<< argv[1] << endl;
    string reference = readReferenceFile(argv[3]);
    findSwitches(argv[1],argv[2],reference);
    //scoreIndividualReads();
    cout << "Ended"<< argv[1] << endl;


}